

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O3

void __thiscall Connection::onClientDisconnected(Connection *this,SharedPtr *param_1)

{
  __shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  this->mIsConnected = false;
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            (local_20,(__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

void onClientDisconnected(const SocketClient::SharedPtr&) { mIsConnected = false; mDisconnected(shared_from_this()); }